

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O2

void __thiscall MODEL3D::three_dim_model::initialize_python_script(three_dim_model *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = &this->py_script;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"\"\"\"Python Circuit TCAD Script Generated with Katana\"\"\"",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "# Initialization ================================================",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"import FreeCAD, Part, time",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  if (this->enable_multiprocessing == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bStack_58,"import concurrent.futures",(allocator<char> *)&local_38);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &bStack_58);
    std::__cxx11::string::~string((string *)&bStack_58);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"from FreeCAD import Base",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::operator+(&local_38,"My_doc = FreeCAD.newDocument(\"",&this->cell_name);
  std::operator+(&bStack_58,&local_38,"\")");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "# Set up functions ==============================================",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"class Ingredient:",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    def __init__(self, gp, ct, ps, sb, of):",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"        self.gp = gp                        # Ground Plane",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"        self.ct = ct                        # Contour",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"        self.ps = ps                        # Position",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "        self.sb = sb                        # Start Base (True/False",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"        self.of = of \t\t\t\t         # Overlap Factor",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"def create_pss(f_ingr):",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    #convert base and contour to freecad vector",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    ts = time.perf_counter()",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    fc_gp = [FreeCAD.Vector(i) for i in f_ingr.gp]",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    fc_ct = [FreeCAD.Vector(i) for i in f_ingr.ct]",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    fc_ps = FreeCAD.Vector(f_ingr.ps)",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    #create the shape",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    wire = Part.makePolygon(fc_gp)",(allocator<char> *)&local_38)
  ;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    gwire = Part.Wire(wire)",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    last_p = len(fc_ct)-1",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    last_p_z = fc_ct[last_p].z",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    spline = Part.BSplineCurve(fc_ct)",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    if (f_ingr.sb==True): # not inverted",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"        if ((f_ingr.of>1)and(f_ingr.of<=2)):#has overlap scale",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "            offset_lower_pt = FreeCAD.Vector(-fc_ct[last_p].x*f_ingr.of, fc_ct[0].y, fc_ct[0].z)"
             ,(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "            offset_upper_pt = FreeCAD.Vector(offset_lower_pt.x, fc_ct[last_p].y, fc_ct[last_p].z)"
             ,(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "            offset_ln = Part.LineSegment(spline.StartPoint, offset_lower_pt)",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "            vert_ln = Part.LineSegment(offset_lower_pt, offset_upper_pt)",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "            horiz_ln = Part.LineSegment(offset_upper_pt, spline.EndPoint)",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "            profile = Part.Shape([offset_ln, vert_ln, horiz_ln, spline])",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"        elif ( f_ingr.of == 1 ):#no overlap scale",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "            upper_point = FreeCAD.Vector(spline.StartPoint.x, spline.StartPoint.y, spline.EndPoint.z)"
             ,(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "            vertical_ln = Part.LineSegment(spline.StartPoint, upper_point)",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "            horiz_ln = Part.LineSegment(upper_point, spline.EndPoint)",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "            profile = Part.Shape([vertical_ln, horiz_ln, spline])",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"        else:",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "            raise Exception(\'Overlap factor must be within the range [1, 2]\')",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"        profile_wire = Part.Wire(profile.Edges)",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "        pl = FreeCAD.Placement(FreeCAD.Vector(0,0,0), FreeCAD.Rotation(FreeCAD.Vector(0,0,1), 180))"
             ,(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"        profile_wire.Placement = pl",(allocator<char> *)&local_38
            );
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    else: # inverted",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"        if ((f_ingr.of>1)and(f_ingr.of<=2)): #has overlap scale",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"            spline_end = fc_ct[last_p]",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "            offset_point = FreeCAD.Vector( (fc_ct[last_p].x*f_ingr.of), fc_ct[last_p].y, fc_ct[last_p].z )"
             ,(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "            offset_upper = Part.LineSegment(spline_end, offset_point)",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"            base_point = FreeCAD.Vector(offset_point.x,0,0)",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"            vert_ln = Part.LineSegment(offset_point, base_point)"
             ,(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "            horiz_ln = Part.LineSegment(base_point, spline.StartPoint)",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "            profile = Part.Shape([spline, offset_upper, vert_ln, horiz_ln])",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"        elif (f_ingr.of==1):#no overlap scale",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "            lower_point = FreeCAD.Vector(spline.EndPoint.x, spline.EndPoint.y, 0)",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "            vert_ln = Part.LineSegment(spline.EndPoint, lower_point)",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "            horiz_ln = Part.LineSegment(lower_point, spline.StartPoint)",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"            profile = Part.Shape([spline, vert_ln, horiz_ln])",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"        else:",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "            raise Exception(\'Overlap factor must be within the range [1, 2]\')",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"        profile_wire = Part.Wire(profile.Edges)",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "        pl = FreeCAD.Placement(FreeCAD.Vector(-fc_ct[last_p].x,0,0), FreeCAD.Rotation(FreeCAD.Vector(0,0,1), 0))"
             ,(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"        profile_wire.Placement = pl",(allocator<char> *)&local_38
            );
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    makeSolid=True",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    isFrenet=True",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    TransitionMode=2#rounded edges",(allocator<char> *)&local_38)
  ;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "    os = gwire.makePipeShell([profile_wire],makeSolid,isFrenet, TransitionMode)",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    os=os.removeSplitter()",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    if os.isNull()==True:",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "        raise Exception(\'Prismatic Spline Sweep creation failed: sweep is null.\')",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    face = Part.Face(wire)",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    prism = face.extrude(FreeCAD.Vector(0,0,last_p_z))",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    final_pss = os.fuse(prism)",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    if final_pss.isNull()==True:",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "        raise Exception(\'Prismatic Spline Sweep creation failed at merge.\')",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    final_pss = final_pss.removeSplitter()",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "    pl = FreeCAD.Placement(fc_ps, FreeCAD.Rotation(FreeCAD.Vector(0,0,1), 0))",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    final_pss.Placement = pl",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    if final_pss.isNull()==True:",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "        raise Exception(\'Prismatic Spline Sweep creation failed: return shape is null.\')"
             ,(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    else:",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"        te = time.perf_counter() - ts",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"        fmt = format(te, \'.2f\')",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"        print(\'PSS created in \'+fmt+\' seconds.\')",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    return final_pss",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"def create_prism(f_ingr):",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    ts = time.perf_counter()",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    fc_gp = [FreeCAD.Vector(i) for i in f_ingr.gp]",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    fc_ct = [FreeCAD.Vector(i) for i in f_ingr.ct]",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    fc_ps = FreeCAD.Vector(f_ingr.ps)",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    wire = Part.makePolygon(fc_gp)",(allocator<char> *)&local_38)
  ;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    gwire = Part.Wire(wire)",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    face = Part.Face(gwire)",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    last_p = len(fc_ct)-1",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    last_p_z = fc_ct[last_p].z",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    prism = face.extrude(FreeCAD.Vector(0,0,last_p_z))",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "    pl = FreeCAD.Placement(fc_ps, FreeCAD.Rotation(FreeCAD.Vector(0,0,1), 0))",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    prism.Placement = pl",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    if prism.isNull()==True:",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "        raise Exception(\'Prism creation failed: return shape is null.\')",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    else:",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"        te = time.perf_counter() - ts",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"        fmt = format(te, \'.2f\')",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"        print(\'Prism created in \'+fmt+\' seconds.\')",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    return prism",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,
             "# Generated cell description ====================================",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"# Line for MS Windows compatibility",(allocator<char> *)&local_38
            );
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"if __name__ == \'__main__\':",(allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    time_start = time.perf_counter()",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  return;
}

Assistant:

void MODEL3D::three_dim_model::initialize_python_script()
{
    py_script.clear();
    py_script.push_back("\"\"\"Python Circuit TCAD Script Generated with Katana\"\"\"");
    py_script.push_back("# Initialization ================================================");
    py_script.push_back("import FreeCAD, Part, time");
    if(enable_multiprocessing==true)
        py_script.push_back("import concurrent.futures");
    py_script.push_back("from FreeCAD import Base");
    py_script.push_back("My_doc = FreeCAD.newDocument(\""+cell_name+"\")");
    py_script.push_back("");
    py_script.push_back("# Set up functions ==============================================");
    py_script.push_back("class Ingredient:");
    py_script.push_back("    def __init__(self, gp, ct, ps, sb, of):");
    py_script.push_back("        self.gp = gp                        # Ground Plane");
    py_script.push_back("        self.ct = ct                        # Contour");
    py_script.push_back("        self.ps = ps                        # Position");
    py_script.push_back("        self.sb = sb                        # Start Base (True/False");
    py_script.push_back("        self.of = of 				         # Overlap Factor");
    py_script.push_back("");
    py_script.push_back("def create_pss(f_ingr):");
    py_script.push_back("    #convert base and contour to freecad vector");
    py_script.push_back("    ts = time.perf_counter()");
    py_script.push_back("    fc_gp = [FreeCAD.Vector(i) for i in f_ingr.gp]");
    py_script.push_back("    fc_ct = [FreeCAD.Vector(i) for i in f_ingr.ct]");
    py_script.push_back("    fc_ps = FreeCAD.Vector(f_ingr.ps)");
    py_script.push_back("    #create the shape");
    py_script.push_back("    wire = Part.makePolygon(fc_gp)");
    py_script.push_back("    gwire = Part.Wire(wire)");
    py_script.push_back("    last_p = len(fc_ct)-1");
    py_script.push_back("    last_p_z = fc_ct[last_p].z");
    py_script.push_back("    spline = Part.BSplineCurve(fc_ct)");
    py_script.push_back("    if (f_ingr.sb==True): # not inverted");
    py_script.push_back("        if ((f_ingr.of>1)and(f_ingr.of<=2)):#has overlap scale");
    py_script.push_back("            offset_lower_pt = FreeCAD.Vector(-fc_ct[last_p].x*f_ingr.of, fc_ct[0].y, fc_ct[0].z)");
    py_script.push_back("            offset_upper_pt = FreeCAD.Vector(offset_lower_pt.x, fc_ct[last_p].y, fc_ct[last_p].z)");
    py_script.push_back("            offset_ln = Part.LineSegment(spline.StartPoint, offset_lower_pt)");
    py_script.push_back("            vert_ln = Part.LineSegment(offset_lower_pt, offset_upper_pt)");
    py_script.push_back("            horiz_ln = Part.LineSegment(offset_upper_pt, spline.EndPoint)");
    py_script.push_back("            profile = Part.Shape([offset_ln, vert_ln, horiz_ln, spline])");
    py_script.push_back("        elif ( f_ingr.of == 1 ):#no overlap scale");
    py_script.push_back("            upper_point = FreeCAD.Vector(spline.StartPoint.x, spline.StartPoint.y, spline.EndPoint.z)");
    py_script.push_back("            vertical_ln = Part.LineSegment(spline.StartPoint, upper_point)");
    py_script.push_back("            horiz_ln = Part.LineSegment(upper_point, spline.EndPoint)");
    py_script.push_back("            profile = Part.Shape([vertical_ln, horiz_ln, spline])");
    py_script.push_back("        else:");
    py_script.push_back("            raise Exception('Overlap factor must be within the range [1, 2]')");
    py_script.push_back("        profile_wire = Part.Wire(profile.Edges)");
    py_script.push_back("        pl = FreeCAD.Placement(FreeCAD.Vector(0,0,0), FreeCAD.Rotation(FreeCAD.Vector(0,0,1), 180))");
    py_script.push_back("        profile_wire.Placement = pl");
    py_script.push_back("    else: # inverted");
    py_script.push_back("        if ((f_ingr.of>1)and(f_ingr.of<=2)): #has overlap scale");
    py_script.push_back("            spline_end = fc_ct[last_p]");
    py_script.push_back("            offset_point = FreeCAD.Vector( (fc_ct[last_p].x*f_ingr.of), fc_ct[last_p].y, fc_ct[last_p].z )");
    py_script.push_back("            offset_upper = Part.LineSegment(spline_end, offset_point)");
    py_script.push_back("            base_point = FreeCAD.Vector(offset_point.x,0,0)");
    py_script.push_back("            vert_ln = Part.LineSegment(offset_point, base_point)");
    py_script.push_back("            horiz_ln = Part.LineSegment(base_point, spline.StartPoint)");
    py_script.push_back("            profile = Part.Shape([spline, offset_upper, vert_ln, horiz_ln])");
    py_script.push_back("        elif (f_ingr.of==1):#no overlap scale");
    py_script.push_back("            lower_point = FreeCAD.Vector(spline.EndPoint.x, spline.EndPoint.y, 0)");
    py_script.push_back("            vert_ln = Part.LineSegment(spline.EndPoint, lower_point)");
    py_script.push_back("            horiz_ln = Part.LineSegment(lower_point, spline.StartPoint)");
    py_script.push_back("            profile = Part.Shape([spline, vert_ln, horiz_ln])");
    py_script.push_back("        else:");
    py_script.push_back("            raise Exception('Overlap factor must be within the range [1, 2]')");
    py_script.push_back("        profile_wire = Part.Wire(profile.Edges)");
    py_script.push_back("        pl = FreeCAD.Placement(FreeCAD.Vector(-fc_ct[last_p].x,0,0), FreeCAD.Rotation(FreeCAD.Vector(0,0,1), 0))");
    py_script.push_back("        profile_wire.Placement = pl");
    py_script.push_back("    makeSolid=True");
    py_script.push_back("    isFrenet=True");
    py_script.push_back("    TransitionMode=2#rounded edges");
    py_script.push_back("    os = gwire.makePipeShell([profile_wire],makeSolid,isFrenet, TransitionMode)");
    py_script.push_back("    os=os.removeSplitter()");
    py_script.push_back("    if os.isNull()==True:");
    py_script.push_back("        raise Exception('Prismatic Spline Sweep creation failed: sweep is null.')");
    py_script.push_back("    face = Part.Face(wire)");
    py_script.push_back("    prism = face.extrude(FreeCAD.Vector(0,0,last_p_z))");
    py_script.push_back("    final_pss = os.fuse(prism)");
    py_script.push_back("    if final_pss.isNull()==True:");
    py_script.push_back("        raise Exception('Prismatic Spline Sweep creation failed at merge.')");
    py_script.push_back("    final_pss = final_pss.removeSplitter()");
    py_script.push_back("    pl = FreeCAD.Placement(fc_ps, FreeCAD.Rotation(FreeCAD.Vector(0,0,1), 0))");
    py_script.push_back("    final_pss.Placement = pl");
    py_script.push_back("    if final_pss.isNull()==True:");
    py_script.push_back("        raise Exception('Prismatic Spline Sweep creation failed: return shape is null.')");
    py_script.push_back("    else:");
    py_script.push_back("        te = time.perf_counter() - ts");
    py_script.push_back("        fmt = format(te, '.2f')");
    py_script.push_back("        print('PSS created in '+fmt+' seconds.')");
    py_script.push_back("    return final_pss");
    py_script.push_back("");
    // Prism for Al layers
    py_script.push_back("def create_prism(f_ingr):");
    py_script.push_back("    ts = time.perf_counter()");
    py_script.push_back("    fc_gp = [FreeCAD.Vector(i) for i in f_ingr.gp]");
    py_script.push_back("    fc_ct = [FreeCAD.Vector(i) for i in f_ingr.ct]");
    py_script.push_back("    fc_ps = FreeCAD.Vector(f_ingr.ps)");
    py_script.push_back("    wire = Part.makePolygon(fc_gp)");
    py_script.push_back("    gwire = Part.Wire(wire)");
    py_script.push_back("    face = Part.Face(gwire)");
    py_script.push_back("    last_p = len(fc_ct)-1");
    py_script.push_back("    last_p_z = fc_ct[last_p].z");
    py_script.push_back("    prism = face.extrude(FreeCAD.Vector(0,0,last_p_z))");
    py_script.push_back("    pl = FreeCAD.Placement(fc_ps, FreeCAD.Rotation(FreeCAD.Vector(0,0,1), 0))");
    py_script.push_back("    prism.Placement = pl");
    py_script.push_back("    if prism.isNull()==True:");
    py_script.push_back("        raise Exception('Prism creation failed: return shape is null.')");
    py_script.push_back("    else:");
    py_script.push_back("        te = time.perf_counter() - ts");
    py_script.push_back("        fmt = format(te, '.2f')");
    py_script.push_back("        print('Prism created in '+fmt+' seconds.')");
    py_script.push_back("    return prism");
    py_script.push_back("# Generated cell description ====================================");
    py_script.push_back("# Line for MS Windows compatibility");
    py_script.push_back("if __name__ == '__main__':");
    py_script.push_back("    time_start = time.perf_counter()");
}